

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamToolsIndex::ReadBlocks
          (BamToolsIndex *this,BtiReferenceSummary *refSummary,BtiBlockVector *blocks)

{
  pointer *ppBVar1;
  pointer pBVar2;
  iterator __position;
  int iVar3;
  BtiBlock block;
  BtiBlock local_40;
  
  pBVar2 = (blocks->
           super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((blocks->
      super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
      )._M_impl.super__Vector_impl_data._M_finish != pBVar2) {
    (blocks->
    super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>)
    ._M_impl.super__Vector_impl_data._M_finish = pBVar2;
  }
  std::vector<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>::reserve
            (blocks,(long)refSummary->NumBlocks);
  local_40._0_8_ = refSummary->FirstBlockFilePosition;
  iVar3 = 0;
  Seek(this,(int64_t *)&local_40,0);
  local_40._0_8_ = local_40._0_8_ & 0xffffffff00000000;
  local_40.StartOffset = 0;
  local_40.StartPosition = 0;
  if (0 < refSummary->NumBlocks) {
    do {
      ReadBlock(this,&local_40);
      __position._M_current =
           (blocks->
           super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (blocks->
          super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<BamTools::Internal::BtiBlock,std::allocator<BamTools::Internal::BtiBlock>>::
        _M_realloc_insert<BamTools::Internal::BtiBlock_const&>
                  ((vector<BamTools::Internal::BtiBlock,std::allocator<BamTools::Internal::BtiBlock>>
                    *)blocks,__position,&local_40);
      }
      else {
        *(ulong *)&(__position._M_current)->StartPosition =
             CONCAT44(local_40._20_4_,local_40.StartPosition);
        (__position._M_current)->MaxEndPosition = local_40.MaxEndPosition;
        *(undefined4 *)&(__position._M_current)->field_0x4 = local_40._4_4_;
        (__position._M_current)->StartOffset = local_40.StartOffset;
        ppBVar1 = &(blocks->
                   super__Vector_base<BamTools::Internal::BtiBlock,_std::allocator<BamTools::Internal::BtiBlock>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppBVar1 = *ppBVar1 + 1;
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 < refSummary->NumBlocks);
  }
  return;
}

Assistant:

void BamToolsIndex::ReadBlocks(const BtiReferenceSummary& refSummary, BtiBlockVector& blocks)
{

    // prep blocks container
    blocks.clear();
    blocks.reserve(refSummary.NumBlocks);

    // skip to first block entry
    Seek(refSummary.FirstBlockFilePosition, SEEK_SET);

    // read & store block entries
    BtiBlock block;
    for (int i = 0; i < refSummary.NumBlocks; ++i) {
        ReadBlock(block);
        blocks.push_back(block);
    }
}